

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.hpp
# Opt level: O3

void __thiscall Constraint::Constraint(Constraint *this)

{
  Expression *__p;
  
  this->lowerbound = -INFINITY;
  this->upperbound = INFINITY;
  __p = (Expression *)operator_new(0x58);
  (__p->linterms).
  super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->linterms).
  super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->linterms).
  super__Vector_base<std::shared_ptr<LinTerm>,_std::allocator<std::shared_ptr<LinTerm>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->quadterms).
  super__Vector_base<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->quadterms).
  super__Vector_base<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->quadterms).
  super__Vector_base<std::shared_ptr<QuadTerm>,_std::allocator<std::shared_ptr<QuadTerm>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __p->offset = 0.0;
  (__p->name)._M_dataplus._M_p = (pointer)&(__p->name).field_2;
  (__p->name)._M_string_length = 0;
  (__p->name).field_2._M_local_buf[0] = '\0';
  (this->expr).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Expression*>
            (&(this->expr).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             __p);
  return;
}

Assistant:

Constraint() : expr(std::shared_ptr<Expression>(new Expression)){}